

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_MutateNothingByVisitIdempotent_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_MutateNothingByVisitIdempotent_Test>
             *this)

{
  VisitFieldsTest *this_00;
  
  WithParamInterface<google::protobuf::internal::(anonymous_namespace)::TestParam>::parameter_ =
       &this->parameter_;
  this_00 = (VisitFieldsTest *)operator_new(0xd0);
  google::protobuf::internal::anon_unknown_0::VisitFieldsTest::VisitFieldsTest(this_00);
  (this_00->super_TestWithParam<google::protobuf::internal::(anonymous_namespace)::TestParam>).
  super_Test._vptr_Test = (_func_int **)&PTR__VisitFieldsTest_01913e08;
  (this_00->super_TestWithParam<google::protobuf::internal::(anonymous_namespace)::TestParam>).
  super_WithParamInterface<google::protobuf::internal::(anonymous_namespace)::TestParam>.
  _vptr_WithParamInterface =
       (_func_int **)&PTR__VisitFieldsTest_MutateNothingByVisitIdempotent_Test_01913e48;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }